

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::udp_socket::wrap
          (udp_socket *this,endpoint *ep,span<const_char> p,error_code *ec,udp_send_flags_t flags)

{
  element_type *peVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t addrlen;
  set_dont_frag df;
  char *local_180;
  socket_addr_type local_178;
  undefined4 uStack_168;
  undefined8 uStack_164;
  buf local_158;
  char *local_148;
  long local_140;
  long local_138;
  array<char,_255UL> header;
  
  local_180 = header._M_elems + 4;
  header._M_elems[0] = '\0';
  header._M_elems[1] = '\0';
  header._M_elems[2] = '\0';
  header._M_elems[3] = ((ep->impl_).data_.base.sa_family != 2) * '\x03' + '\x01';
  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>(ep,&local_180);
  sVar3 = (long)local_180 - (long)&header;
  set_dont_frag::set_dont_frag
            (&df,&this->m_socket,(bool)((ep->impl_).data_.base.sa_family == 2 & flags.m_val >> 3));
  peVar1 = (this->m_socks5_connection).
           super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178._0_8_ = *(undefined8 *)&(peVar1->m_udp_proxy_addr).impl_.data_;
  uVar2 = *(undefined8 *)((long)&(peVar1->m_udp_proxy_addr).impl_.data_ + 8);
  uStack_164 = *(undefined8 *)((long)&(peVar1->m_udp_proxy_addr).impl_.data_ + 0x14);
  uStack_168 = (undefined4)
               ((ulong)*(undefined8 *)((long)&(peVar1->m_udp_proxy_addr).impl_.data_ + 0xc) >> 0x20)
  ;
  local_178.sa_data._6_4_ = SUB84(uVar2,0);
  local_178.sa_data._10_4_ = SUB84((ulong)uVar2 >> 0x20,0);
  local_138 = sVar3 + p.m_len;
  addrlen = 0x1c;
  if (local_178.sa_family == 2) {
    addrlen = 0x10;
  }
  local_158.iov_base = &header;
  local_158.iov_len = sVar3;
  local_148 = p.m_ptr;
  local_140 = p.m_len;
  boost::asio::detail::socket_ops::sync_sendto
            ((this->m_socket).
             super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .
             super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.implementation_.super_base_implementation_type.socket_,
             (this->m_socket).
             super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .
             super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             .impl_.implementation_.super_base_implementation_type.state_,&local_158,2,0,&local_178,
             addrlen,ec);
  set_dont_frag::~set_dont_frag(&df);
  return;
}

Assistant:

void udp_socket::wrap(udp::endpoint const& ep, span<char const> p
	, error_code& ec, udp_send_flags_t const flags)
{
	TORRENT_UNUSED(flags);
	using namespace libtorrent::aux;

	std::array<char, max_header_size> header;
	char* h = header.data();

	write_uint16(0, h); // reserved
	write_uint8(0, h); // fragment
	write_uint8(aux::is_v4(ep) ? 1 : 4, h); // atyp
	write_endpoint(ep, h);

	std::array<boost::asio::const_buffer, 2> iovec;
	iovec[0] = boost::asio::const_buffer(header.data(), aux::numeric_cast<std::size_t>(h - header.data()));
	iovec[1] = boost::asio::const_buffer(p.data(), static_cast<std::size_t>(p.size()));

	// set the DF flag for the socket and clear it again in the destructor
	set_dont_frag df(m_socket, (flags & dont_fragment) && aux::is_v4(ep));

	m_socket.send_to(iovec, m_socks5_connection->target(), 0, ec);
}